

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:222:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:222:17)>
             *this)

{
  Own<kj::PromiseFulfiller<unsigned_int>,_std::nullptr_t> *pOVar1;
  Disposer *pDVar2;
  PromiseFulfiller<unsigned_int> *pPVar3;
  Promise<unsigned_int> *pPVar4;
  PromiseArenaMember *node;
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *pMVar5;
  PromiseBase node_00;
  long *plVar6;
  WeakFulfiller<unsigned_int> *pWVar7;
  Executor *pEVar8;
  WeakFulfillerBase *pWVar9;
  PromiseFulfiller<unsigned_int> *ptrCopy;
  long in_FS_OFFSET;
  DebugComparison<unsigned_int,_int> _kjCondition;
  WaitScope waitScope;
  Fault f;
  EventLoop loop;
  UnixEventPort port;
  char local_221;
  PromiseBase local_220;
  WeakFulfillerBase *local_218;
  long *local_210;
  undefined8 local_208;
  char *local_200;
  Maybe<const_kj::Executor_&> *local_1f8;
  bool local_1f0;
  char *local_1e8;
  char *pcStack_1e0;
  undefined8 local_1d8;
  EventLoop *local_1d0;
  undefined4 local_1c8;
  long local_1c0;
  undefined8 uStack_1b8;
  Fault local_1b0 [2];
  EventLoop local_1a0;
  UnixEventPort local_128;
  
  *(undefined1 *)(in_FS_OFFSET + -0x41) = 1;
  UnixEventPort::UnixEventPort(&local_128);
  EventLoop::EventLoop(&local_1a0,&local_128.super_EventPort);
  local_1c8 = 0xffffffff;
  local_1c0 = 0;
  uStack_1b8 = 0;
  local_1d0 = &local_1a0;
  EventLoop::enterScope(&local_1a0);
  pWVar7 = (WeakFulfiller<unsigned_int> *)operator_new(0x18);
  pWVar9 = &pWVar7->super_WeakFulfillerBase;
  (pWVar7->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (pWVar7->super_PromiseFulfiller<unsigned_int>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00608418;
  (pWVar7->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00608450;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<unsigned_int>&>
            ((PromiseDisposer *)&local_220,pWVar7);
  pOVar1 = (this->f).fulfiller;
  pDVar2 = pOVar1->disposer;
  pPVar3 = pOVar1->ptr;
  pOVar1->disposer = &pWVar9->super_Disposer;
  pOVar1->ptr = (PromiseFulfiller<unsigned_int> *)pWVar7;
  local_210 = (long *)0x0;
  local_218 = pWVar9;
  if (pPVar3 != (PromiseFulfiller<unsigned_int> *)0x0) {
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                      (long)&(pPVar3->super_PromiseRejector)._vptr_PromiseRejector);
  }
  pWVar7 = (WeakFulfiller<unsigned_int> *)operator_new(0x18);
  (pWVar7->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (pWVar7->super_PromiseFulfiller<unsigned_int>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00608418;
  (pWVar7->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00608450;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<unsigned_int>&>
            ((PromiseDisposer *)&local_208,pWVar7);
  pPVar4 = (this->f).promise;
  node = &((pPVar4->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
  (pPVar4->super_PromiseBase).node.ptr = (PromiseNode *)local_208;
  if (node != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node);
  }
  pEVar8 = getCurrentThreadExecutor();
  pMVar5 = (this->f).executor;
  local_208 = (undefined **)((ulong)local_208 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&pMVar5->mutex,0,(DebugComparison<unsigned_int,_int> *)&local_208);
  (pMVar5->value).ptr = pEVar8;
  kj::_::Mutex::unlock(&pMVar5->mutex,EXCLUSIVE,(Waiter *)0x0);
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
  ;
  pcStack_1e0 = "operator()";
  local_1d8 = 0x31000000eb;
  local_208._0_4_ = Promise<unsigned_int>::wait((Promise<unsigned_int> *)&local_220,&local_1d0);
  local_208._4_4_ = 0x7b;
  local_200 = " == ";
  local_1f8 = (Maybe<const_kj::Executor_&> *)0x5;
  local_1f0 = (uint)local_208 == 0x7b;
  if (local_1f0) {
    local_208 = (undefined **)0x7b00000141;
    (*(pWVar7->super_PromiseFulfiller<unsigned_int>).super_PromiseRejector._vptr_PromiseRejector[2])
              (pWVar7);
    EventLoop::run(&local_1a0,0xffffffff);
    pMVar5 = (this->f).executor;
    local_208 = (undefined **)((ulong)local_208 & 0xffffffffffffff00);
    kj::_::Mutex::lock(&pMVar5->mutex,0);
    local_1f8 = &pMVar5->value;
    local_208 = &PTR_check_0060abc8;
    local_200 = &local_221;
    local_1b0[0].exception._0_1_ = 0;
    kj::_::Mutex::wait(&pMVar5->mutex,&local_208);
    kj::_::Mutex::unlock(&pMVar5->mutex,EXCLUSIVE,(Waiter *)0x0);
    (**(pWVar7->super_WeakFulfillerBase).super_Disposer._vptr_Disposer)
              (&pWVar7->super_WeakFulfillerBase,
               (pWVar7->super_PromiseFulfiller<unsigned_int>).super_PromiseRejector.
               _vptr_PromiseRejector[-2] +
               (long)&(pWVar7->super_PromiseFulfiller<unsigned_int>).super_PromiseRejector.
                      _vptr_PromiseRejector);
    plVar6 = local_210;
    if (local_210 != (long *)0x0) {
      local_210 = (long *)0x0;
      (**(local_218->super_Disposer)._vptr_Disposer)
                (local_218,(long)plVar6 + *(long *)(*plVar6 + -0x10));
    }
    node_00.node.ptr = local_220.node.ptr;
    if (local_220.node.ptr != (PromiseNode *)0x0) {
      local_220.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00.node.ptr);
    }
    if (local_1c0 == 0) {
      EventLoop::leaveScope(local_1d0);
    }
    EventLoop::~EventLoop(&local_1a0);
    UnixEventPort::~UnixEventPort(&local_128);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
            (local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
             ,0xeb,FAILED,"paf.promise.wait(waitScope) == 123","_kjCondition,",
             (DebugComparison<unsigned_int,_int> *)&local_208);
  kj::_::Debug::Fault::fatal(local_1b0);
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }